

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocketEngine_unix_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::TcpSocketEngine::nativeCreateSocket
          (TcpSocketEngine *this,NetworkProtocol protocol)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar2 = socket((uint)(protocol == IPv6Protocol) * 8 + 2,1,6);
  if (0 < iVar2) {
    this->m_socketDescriptor = iVar2;
    goto LAB_001c0ddd;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  if ((iVar1 - 0x17U < 2) || (iVar1 == 0xc)) {
LAB_001c0dc2:
    this->m_socketError = SocketResourceError;
  }
  else if (iVar1 == 0xd) {
    this->m_socketError = SocketAccessError;
  }
  else {
    if ((iVar1 != 0x16) && (iVar1 != 0x5d)) {
      if (iVar1 == 0x69) goto LAB_001c0dc2;
      if (iVar1 != 0x61) goto LAB_001c0ddd;
    }
    this->m_socketError = UnsupportedSocketOperationError;
  }
  std::__cxx11::string::assign((char *)&this->m_errorString);
LAB_001c0ddd:
  return 0 < iVar2;
}

Assistant:

bool TcpSocketEngine::nativeCreateSocket(HostAddress::NetworkProtocol protocol)
{

    // get protocol value for requested protocol type
    const int protocolNum = ((protocol == HostAddress::IPv6Protocol) ? AF_INET6 : AF_INET);

    // attempt to create socket
    int socketFd = socket(protocolNum, SOCK_STREAM, IPPROTO_TCP);

    // if we fetched an invalid socket descriptor
    if (socketFd <= 0) {

        // see what error we got
        switch (errno) {
            case EPROTONOSUPPORT:
            case EAFNOSUPPORT:
            case EINVAL:
                m_socketError = TcpSocket::UnsupportedSocketOperationError;
                m_errorString = "protocol not supported";
                break;
            case ENFILE:
            case EMFILE:
            case ENOBUFS:
            case ENOMEM:
                m_socketError = TcpSocket::SocketResourceError;
                m_errorString = "out of resources";
                break;
            case EACCES:
                m_socketError = TcpSocket::SocketAccessError;
                m_errorString = "permission denied";
                break;
            default:
                break;
        }

        // return failure
        return false;
    }

    // otherwise, store our socket FD & return success
    m_socketDescriptor = socketFd;
    return true;
}